

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_long>::on_hex
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *specs;
  bool bVar3;
  anon_class_16_2_cb75083a_for_f_conflict f;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar4;
  ulong uVar5;
  int num_digits;
  string_view prefix;
  undefined4 uStack_c;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = specs->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = 0;
  uVar5 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar3 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar3);
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.this = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  bVar4 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_long>::on_hex()::_lambda(char*)_1_>
                    ((this->out).container,num_digits,prefix,specs,f);
  (this->out).container = bVar4.container;
  return;
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }